

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_element<0>(xml_document<char> *this,char **text)

{
  char cVar1;
  xml_node<char> *node;
  size_t sVar2;
  char *pcVar3;
  parse_error *this_00;
  pointer_____offset_0x10___ *ppuVar4;
  char *pcVar5;
  
  node = memory_pool<char>::allocate_node
                   (&this->super_memory_pool<char>,node_element,(char *)0x0,(char *)0x0,0,0);
  pcVar5 = *text;
  skip<rapidxml::xml_document<char>::element_name_pred,0>(text);
  cVar1 = **text;
  sVar2 = (long)*text - (long)pcVar5;
  if (sVar2 == 0) {
    this_00 = (parse_error *)__cxa_allocate_exception(0x18);
    if (cVar1 != '\0') {
      parse_error::parse_error(this_00,"expected element name or prefix",*text);
LAB_00118e63:
      ppuVar4 = &parse_error::typeinfo;
      goto LAB_00118e6a;
    }
    eof_error::eof_error((eof_error *)this_00,"expected element name or prefix",*text);
  }
  else {
    if (cVar1 == ':') {
      node->m_prefix = pcVar5;
      node->m_prefix_size = sVar2;
      pcVar5 = *text + 1;
      *text = pcVar5;
      skip<rapidxml::xml_document<char>::node_name_pred,0>(text);
      sVar2 = (long)*text - (long)pcVar5;
      if (sVar2 == 0) {
        cVar1 = **text;
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        if (cVar1 != '\0') {
          parse_error::parse_error(this_00,"expected element local name",*text);
          goto LAB_00118e63;
        }
        eof_error::eof_error((eof_error *)this_00,"expected element local name",*text);
        goto LAB_00118e2f;
      }
    }
    (node->super_xml_base<char>).m_name = pcVar5;
    (node->super_xml_base<char>).m_name_size = sVar2;
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    parse_node_attributes<0>(this,text,node);
    pcVar5 = *text;
    cVar1 = *pcVar5;
    if (cVar1 == '/') {
      *text = pcVar5 + 1;
      if (pcVar5[1] == '>') {
        *text = pcVar5 + 2;
        goto LAB_00118d40;
      }
      if (pcVar5[1] != '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"expected >",*text);
        goto LAB_00118e63;
      }
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error((eof_error *)this_00,"expected >",*text);
    }
    else {
      if (cVar1 == '>') {
        pcVar5 = pcVar5 + 1;
        *text = pcVar5;
        pcVar3 = parse_node_contents<0>(this,text,node);
        if ((long)pcVar3 - (long)pcVar5 != 0) {
          node->m_contents = pcVar5;
          node->m_contents_size = (long)pcVar3 - (long)pcVar5;
        }
LAB_00118d40:
        pcVar5 = (node->super_xml_base<char>).m_name;
        pcVar3 = pcVar5;
        if (pcVar5 != (char *)0x0) {
          pcVar3 = (char *)(node->super_xml_base<char>).m_name_size;
        }
        pcVar5[(long)pcVar3] = '\0';
        if (node->m_prefix != (char *)0x0) {
          node->m_prefix[node->m_prefix_size] = '\0';
        }
        return node;
      }
      if (cVar1 != '\0') {
        this_00 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this_00,"expected >",*text);
        goto LAB_00118e63;
      }
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      eof_error::eof_error((eof_error *)this_00,"expected >",*text);
    }
  }
LAB_00118e2f:
  ppuVar4 = &eof_error::typeinfo;
LAB_00118e6a:
  __cxa_throw(this_00,ppuVar4,std::runtime_error::~runtime_error);
}

Assistant:

xml_node<Ch> *parse_element(Ch *&text)
        {
            // Create element node
            xml_node<Ch> *element = this->allocate_node(node_element);

            // Extract element name
            Ch *prefix = text;
            skip<element_name_pred, Flags>(text);
            if (text == prefix)
                RAPIDXML_PARSE_ERROR("expected element name or prefix", text);
            if (*text == Ch(':')) {
                element->prefix(prefix, text - prefix);
                ++text;
                Ch *name = text;
                skip<node_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected element local name", text);
                element->name(name, text - name);
            } else {
                element->name(prefix, text - prefix);
            }

            // Skip whitespace between element name and attributes or >
            skip<whitespace_pred, Flags>(text);

            // Parse attributes, if any
            parse_node_attributes<Flags>(text, element);

            // Determine ending type
            if (*text == Ch('>'))
            {
                Ch const * contents = ++text;
                Ch const * contents_end = 0;
                if (!(Flags & parse_open_only))
                    contents_end = parse_node_contents<Flags>(text, element);
                std::size_t sz = contents_end - contents;
                if (sz) element->contents(contents, sz);
            }
            else if (*text == Ch('/'))
            {
                ++text;
                if (*text != Ch('>'))
                    RAPIDXML_PARSE_ERROR("expected >", text);
                ++text;
                if (Flags & parse_open_only)
                    RAPIDXML_PARSE_ERROR("open_only, but closed", text);
            }
            else
                RAPIDXML_PARSE_ERROR("expected >", text);

            // Place zero terminator after name
            if (!(Flags & parse_no_string_terminators)) {
                element->name()[element->name_size()] = Ch('\0');
                if (element->prefix()) element->prefix()[element->prefix_size()] = Ch('\0');
            }

            // Return parsed element
            return element;
        }